

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O0

int __thiscall
Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>_>::copy
          (TypedAttribute<Imath_3_2::Matrix44<float>_> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long *plVar1;
  Attribute *attribute;
  
  plVar1 = (long *)operator_new(0x48);
  plVar1[6] = 0;
  plVar1[7] = 0;
  plVar1[4] = 0;
  plVar1[5] = 0;
  plVar1[2] = 0;
  plVar1[3] = 0;
  *plVar1 = 0;
  plVar1[1] = 0;
  plVar1[8] = 0;
  TypedAttribute(this);
  (**(code **)(*plVar1 + 0x30))(plVar1,this);
  return (int)plVar1;
}

Assistant:

Attribute*
TypedAttribute<T>::copy () const
{
    Attribute* attribute = new TypedAttribute<T> ();
    attribute->copyValueFrom (*this);
    return attribute;
}